

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_list(lysp_yin_ctx *ctx,tree_node_meta *node_meta)

{
  uint uVar1;
  long lVar2;
  undefined8 in_stack_fffffffffffffc98;
  uint uVar3;
  ly_ctx *local_120;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  size_t subelems_size;
  yin_subelement *subelems;
  lysp_node *plStack_50;
  LY_ERR ret;
  lysp_node_list *list;
  tree_node_meta *node_meta_local;
  lysp_yin_ctx *ctx_local;
  
  uVar3 = (uint)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  subelems._4_4_ = 0;
  subelems_size = 0;
  list = (lysp_node_list *)node_meta;
  node_meta_local = (tree_node_meta *)ctx;
  plStack_50 = (lysp_node *)calloc(1,0x90);
  if (plStack_50 == (lysp_node *)0x0) {
    ly_log((ly_ctx *)*node_meta_local[4].nodes,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "yin_parse_list");
    ctx_local._4_4_ = LY_EMEM;
  }
  else {
    if (**(long **)((long)&list->field_0 + 8) == 0) {
      **(undefined8 **)((long)&list->field_0 + 8) = plStack_50;
    }
    else {
      lVar2 = **(long **)((long)&list->field_0 + 8);
      while (_ret___1 = (long *)(lVar2 + ((**(long **)((long)&list->field_0 + 8) + 0x10) -
                                         **(long **)((long)&list->field_0 + 8))), *_ret___1 != 0) {
        lVar2 = *_ret___1;
      }
      *_ret___1 = (long)plStack_50;
    }
    plStack_50->nodetype = 0x10;
    plStack_50->parent = (list->field_0).node.parent;
    ctx_local._4_4_ = lyxml_ctx_next((lyxml_ctx *)node_meta_local[4].nodes);
    if (((ctx_local._4_4_ == LY_SUCCESS) &&
        (ctx_local._4_4_ =
              yin_parse_attribute((lysp_yin_ctx *)node_meta_local,YIN_ARG_NAME,&plStack_50->name,
                                  Y_IDENTIF_ARG,LY_STMT_LIST), ctx_local._4_4_ == LY_SUCCESS)) &&
       (ctx_local._4_4_ =
             subelems_allocator((lysp_yin_ctx *)node_meta_local,0x19,plStack_50,
                                (yin_subelement **)&subelems_size,8,&plStack_50[1].iffeatures,
                                (ulong)uVar3 << 0x20,0x20,&plStack_50[1].ref,0,0x40,
                                &plStack_50[1].ref,0,0x200,&plStack_50[1].ref,0,0x50000,
                                &plStack_50->flags,2,0x400,&plStack_50[1].ref,0,0x80000,
                                &plStack_50->dsc,2,0x800,&plStack_50[1].dsc,0,0x130000,
                                &plStack_50->iffeatures,0,0x160000,&plStack_50[1].next,2,0x1000,
                                &plStack_50[1].ref,0,0x2000,&plStack_50[1].ref,0,0x4000,
                                &plStack_50[1].ref,0,0x190000,plStack_50,2,0x1a0000,plStack_50,2,
                                0x1d0000,plStack_50 + 1,0,1,&plStack_50[1].exts,0,0x1f0000,
                                &plStack_50->flags,2,0x270000,&plStack_50->ref,2,0x2c0000,
                                &plStack_50->flags,2,0x2f0000,&plStack_50[1].name,0,0x300000),
       ctx_local._4_4_ == LY_SUCCESS)) {
      subelems._4_4_ =
           yin_parse_content((lysp_yin_ctx *)node_meta_local,(yin_subelement *)subelems_size,0x19,
                             plStack_50,LY_STMT_LIST,(char **)0x0,&plStack_50->exts);
      subelems_deallocator(0x19,(yin_subelement *)subelems_size);
      if (subelems._4_4_ == LY_SUCCESS) {
        ctx_local._4_4_ = yin_unres_exts_add((lysp_yin_ctx *)node_meta_local,plStack_50->exts);
        if (ctx_local._4_4_ == LY_SUCCESS) {
          if ((*(int *)&plStack_50[2].field_0xc == 0) ||
             (uVar3._0_2_ = plStack_50[2].nodetype, uVar3._2_2_ = plStack_50[2].flags,
             uVar3 <= *(uint *)&plStack_50[2].field_0xc)) {
            ctx_local._4_4_ = LY_SUCCESS;
          }
          else {
            if (node_meta_local == (tree_node_meta *)0x0) {
              local_120 = (ly_ctx *)0x0;
            }
            else {
              local_120 = (ly_ctx *)
                          (&node_meta_local[3].nodes[1]->parent)
                          [*(int *)((long)node_meta_local[3].nodes + 4) - 1]->parent->parent;
            }
            uVar1._0_2_ = plStack_50[2].nodetype;
            uVar1._2_2_ = plStack_50[2].flags;
            ly_vlog(local_120,(char *)0x0,LYVE_SEMANTICS,
                    "Invalid combination of min-elements and max-elements: min value %u is bigger than the max value %u."
                    ,(ulong)uVar1,(ulong)*(uint *)&plStack_50[2].field_0xc);
            ctx_local._4_4_ = LY_EVALID;
          }
        }
      }
      else {
        ctx_local._4_4_ = subelems._4_4_;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_list(struct lysp_yin_ctx *ctx, struct tree_node_meta *node_meta)
{
    struct lysp_node_list *list;
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    size_t subelems_size;

    LY_LIST_NEW_RET(ctx->xmlctx->ctx, node_meta->nodes, list, next, LY_EMEM);
    list->nodetype = LYS_LIST;
    list->parent = node_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &list->name, Y_IDENTIF_ARG, LY_STMT_LIST));

    /* parse list content */
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 25, (struct lysp_node *)list, &subelems,
            LY_STMT_ACTION, &list->actions, 0,
            LY_STMT_ANYDATA, &list->child, 0,
            LY_STMT_ANYXML, &list->child, 0,
            LY_STMT_CHOICE, &list->child, 0,
            LY_STMT_CONFIG, &list->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_CONTAINER, &list->child, 0,
            LY_STMT_DESCRIPTION, &list->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_GROUPING, &list->groupings, 0,
            LY_STMT_IF_FEATURE, &list->iffeatures, 0,
            LY_STMT_KEY, &list->key, YIN_SUBELEM_UNIQUE,
            LY_STMT_LEAF, &list->child, 0,
            LY_STMT_LEAF_LIST, &list->child, 0,
            LY_STMT_LIST, &list->child, 0,
            LY_STMT_MAX_ELEMENTS, list, YIN_SUBELEM_UNIQUE,
            LY_STMT_MIN_ELEMENTS, list, YIN_SUBELEM_UNIQUE,
            LY_STMT_MUST, &list->musts, 0,
            LY_STMT_NOTIFICATION, &list->notifs, 0,
            LY_STMT_ORDERED_BY, &list->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &list->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_STATUS, &list->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_TYPEDEF, &list->typedefs, 0,
            LY_STMT_UNIQUE, &list->uniques, 0,
            LY_STMT_USES, &list->child, 0,
            LY_STMT_WHEN, &list->when, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));
    ret = yin_parse_content(ctx, subelems, subelems_size, list, LY_STMT_LIST, NULL, &list->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, list->exts));

    if (list->max && (list->min > list->max)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_MINMAX, list->min, list->max);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}